

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.h
# Opt level: O0

_Bool tcg_op_buf_full(TCGContext_conflict9 *tcg_ctx)

{
  TCGContext_conflict9 *tcg_ctx_local;
  
  return 3999 < tcg_ctx->nb_ops;
}

Assistant:

static inline bool tcg_op_buf_full(TCGContext *tcg_ctx)
{
    /* This is not a hard limit, it merely stops translation when
     * we have produced "enough" opcodes.  We want to limit TB size
     * such that a RISC host can reasonably use a 16-bit signed
     * branch within the TB.  We also need to be mindful of the
     * 16-bit unsigned offsets, TranslationBlock.jmp_reset_offset[]
     * and TCGContext.gen_insn_end_off[].
     */
    return tcg_ctx->nb_ops >= 4000;
}